

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# reflect_object.c
# Opt level: O0

void object_destroy(object obj)

{
  int iVar1;
  uintmax_t uVar2;
  long *in_RDI;
  char *local_20;
  object in_stack_ffffffffffffffe8;
  
  if (in_RDI != (long *)0x0) {
    iVar1 = object_decrement_reference(in_stack_ffffffffffffffe8);
    if (iVar1 != 0) {
      if (*in_RDI == 0) {
        local_20 = "<anonymous>";
      }
      else {
        local_20 = (char *)*in_RDI;
      }
      log_write_impl_va("metacall",0x18a,"object_destroy",
                        "/workspace/llm4binary/github/license_c_cmakelists/metacall[P]core/source/reflect/source/reflect_object.c"
                        ,LOG_LEVEL_ERROR,"Invalid reference counter in object: %s",local_20);
    }
    uVar2 = threading_atomic_ref_count_load((threading_atomic_ref_count)(in_RDI + 4));
    if (uVar2 == 0) {
      if ((in_RDI[3] != 0) && (*(long *)(in_RDI[3] + 0x30) != 0)) {
        (**(code **)(in_RDI[3] + 0x30))(in_RDI,in_RDI[2]);
      }
      if (*in_RDI != 0) {
        free((void *)*in_RDI);
      }
      threading_atomic_ref_count_destroy((threading_atomic_ref_count)(in_RDI + 4));
      free(in_RDI);
      LOCK();
      object_stats.deallocations = object_stats.deallocations + 1;
      UNLOCK();
    }
  }
  return;
}

Assistant:

void object_destroy(object obj)
{
	if (obj != NULL)
	{
		if (object_decrement_reference(obj) != 0)
		{
			log_write("metacall", LOG_LEVEL_ERROR, "Invalid reference counter in object: %s", obj->name ? obj->name : "<anonymous>");
		}

		if (threading_atomic_ref_count_load(&obj->ref) == 0)
		{
			/* TODO: Disable logs here until log is completely thread safe and async signal safe */

			/*
			if (obj->name == NULL)
			{
				log_write("metacall", LOG_LEVEL_DEBUG, "Destroy anonymous object <%p>", (void *)obj);
			}
			else
			{
				log_write("metacall", LOG_LEVEL_DEBUG, "Destroy object %s <%p>", obj->name, (void *)obj);
			}
			*/

			if (obj->interface != NULL && obj->interface->destroy != NULL)
			{
				obj->interface->destroy(obj, obj->impl);
			}

			if (obj->name != NULL)
			{
				free(obj->name);
			}

			threading_atomic_ref_count_destroy(&obj->ref);

			free(obj);

			reflect_memory_tracker_deallocation(object_stats);
		}
	}
}